

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.h
# Opt level: O2

void __thiscall libDAI::TreeEP::TreeEP(TreeEP *this)

{
  _Rb_tree_header *p_Var1;
  
  JTree::JTree(&this->super_JTree);
  p_Var1 = &(this->_Q)._M_t._M_impl.super__Rb_tree_header;
  (this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f6a8;
  *(undefined8 *)&this->Props2 = 0;
  (this->Props2).tol = 0.0;
  (this->Props2).maxiter = 0;
  (this->Props2).verbose = 0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  *(undefined8 *)&(this->_Q)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_Q)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_Q)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_Q)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_Q)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_Q)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TreeEP() : JTree(), Props2(), _maxdiff(0.0), _iterations(0UL), _Q() {}